

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall
gss::innards::Proof::colour_bound
          (Proof *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *ccs)

{
  long *plVar1;
  pointer pvVar2;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar3;
  int *piVar4;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var5;
  key_type *pkVar6;
  pointer ppVar7;
  pointer plVar8;
  pointer ppVar9;
  bool bVar10;
  ostream *poVar11;
  iterator iVar12;
  _Base_ptr p_Var13;
  pointer piVar14;
  mapped_type *pmVar15;
  mapped_type_conflict *pmVar16;
  ulong uVar17;
  pointer piVar18;
  uint uVar19;
  pointer pvVar20;
  key_type *__k;
  pointer ppVar21;
  long lVar22;
  uint uVar23;
  vector<int,_std::allocator<int>_> *cc;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__x;
  int *c;
  int *piVar24;
  uint j;
  ulong uVar25;
  pointer plVar26;
  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  bigger_cc;
  anon_class_8_1_8991fb9c local_b0;
  vector<long,_std::allocator<long>_> to_sum;
  pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  
  std::operator<<((ostream *)
                  (((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  proof_stream)._M_t,"* bound, ccs");
  pvVar2 = (ccs->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar20 = (ccs->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      uVar3._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t, pvVar20 != pvVar2; pvVar20 = pvVar20 + 1) {
    std::operator<<((ostream *)
                    uVar3._M_t.
                    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                    ._M_head_impl," [");
    piVar4 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar24 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        uVar3._M_t.
        super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
        _M_head_impl = (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       proof_stream)._M_t, piVar24 != piVar4; piVar24 = piVar24 + 1) {
      poVar11 = std::operator<<((ostream *)
                                uVar3._M_t.
                                super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                ._M_head_impl," ");
      std::ostream::operator<<(poVar11,*piVar24);
    }
    std::operator<<((ostream *)
                    uVar3._M_t.
                    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                    ._M_head_impl," ]");
  }
  std::operator<<((ostream *)
                  uVar3._M_t.
                  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                  ._M_head_impl,'\n');
  _Var5._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  if (((_Var5._M_head_impl)->recover_encoding != false) &&
     ((_Var5._M_head_impl)->doing_hom_colour_proof == false)) {
    pvVar2 = (ccs->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar20 = (ccs->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pvVar20 != pvVar2;
        pvVar20 = pvVar20 + 1) {
      piVar18 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      piVar14 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((long)piVar18 - (long)piVar14 != 4) {
        uVar19 = 0;
        while (uVar17 = (ulong)uVar19, uVar17 < (ulong)((long)piVar18 - (long)piVar14 >> 2)) {
          uVar19 = uVar19 + 1;
          for (uVar23 = uVar19; uVar25 = (ulong)uVar23,
              uVar25 < (ulong)((long)piVar18 - (long)piVar14 >> 2); uVar23 = uVar23 + 1) {
            local_80.first._0_8_ = SEXT48(piVar14[uVar17]);
            local_80.first.second._M_dataplus._M_p = (pointer)(long)piVar14[uVar25];
            bVar10 = std::
                     map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                     ::contains(&((this->_imp)._M_t.
                                  super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                  .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                 _M_head_impl)->non_edge_constraints,(key_type *)&local_80);
            if (!bVar10) {
              std::operator<<((ostream *)
                              (((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl)->proof_stream)._M_t,"# 0\n");
              poVar11 = std::operator<<((ostream *)
                                        (((this->_imp)._M_t.
                                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                         _M_head_impl)->proof_stream)._M_t,"ea -1 x");
              local_80.first._0_8_ =
                   SEXT48((pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar17]);
              pmVar15 = std::
                        map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&((this->_imp)._M_t.
                                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                      _M_head_impl)->binary_variable_mappings,
                                     (key_type_conflict1 *)&local_80);
              poVar11 = std::operator<<(poVar11,(string *)pmVar15);
              poVar11 = std::operator<<(poVar11," -1 x");
              to_sum.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
              ._M_start = (pointer)(long)(pvVar20->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_start[uVar25];
              pmVar15 = std::
                        map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&((this->_imp)._M_t.
                                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                      _M_head_impl)->binary_variable_mappings,
                                     (key_type_conflict1 *)&to_sum);
              poVar11 = std::operator<<(poVar11,(string *)pmVar15);
              std::operator<<(poVar11," >= -1 ;\n");
              _Var5._M_head_impl =
                   (this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
              lVar22 = (_Var5._M_head_impl)->proof_line + 1;
              (_Var5._M_head_impl)->proof_line = lVar22;
              piVar14 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              local_80.first._0_8_ = SEXT48(piVar14[uVar17]);
              local_80.first.second._M_dataplus._M_p = (pointer)(long)piVar14[uVar25];
              pmVar16 = std::
                        map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                        ::operator[](&(_Var5._M_head_impl)->non_edge_constraints,
                                     (key_type *)&local_80);
              *pmVar16 = lVar22;
              piVar14 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              local_80.first._0_8_ = SEXT48(piVar14[uVar25]);
              local_80.first.second._M_dataplus._M_p = (pointer)(long)piVar14[uVar17];
              pmVar16 = std::
                        map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                        ::operator[](&((this->_imp)._M_t.
                                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                      _M_head_impl)->non_edge_constraints,(key_type *)&local_80);
              *pmVar16 = lVar22;
              poVar11 = std::operator<<((ostream *)
                                        (((this->_imp)._M_t.
                                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                         _M_head_impl)->proof_stream)._M_t,"# ");
              poVar11 = (ostream *)
                        std::ostream::operator<<
                                  (poVar11,((this->_imp)._M_t.
                                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                            .
                                            super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>
                                           ._M_head_impl)->active_level);
              std::operator<<(poVar11,'\n');
            }
            piVar14 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            piVar18 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          }
        }
      }
    }
  }
  to_sum.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  to_sum.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  to_sum.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar2 = (ccs->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar20 = (ccs->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pvVar20 != pvVar2;
      pvVar20 = pvVar20 + 1) {
    piVar24 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar17 = (long)(pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar24;
    if (uVar17 != 4) {
      _Var5._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      if ((_Var5._M_head_impl)->doing_hom_colour_proof == true) {
        bigger_cc.
        super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bigger_cc.
        super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        bigger_cc.
        super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pkVar6 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (__k = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
            _Var5._M_head_impl =
                 (this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl,
            __k != pkVar6; __k = __k + 1) {
          ppVar7 = *(pointer *)((long)&(_Var5._M_head_impl)->p_clique + 8);
          for (__x = *(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       **)&((_Var5._M_head_impl)->p_clique).
                           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ; __x != ppVar7; __x = __x + 1) {
            iVar12 = std::
                     _Rb_tree<int,_std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::find(&(((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->t_clique_neighbourhood)._M_t,__k);
            std::
            pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::
            pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                      (&local_80,__x,
                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&iVar12._M_node[1]._M_parent);
            std::
            vector<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>
            ::
            emplace_back<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>
                      ((vector<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>
                        *)&bigger_cc,&local_80);
            std::
            pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~pair(&local_80);
          }
        }
        std::operator<<((ostream *)((_Var5._M_head_impl)->proof_stream)._M_t,"* colour class [");
        ppVar9 = bigger_cc.
                 super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar21 = bigger_cc.
                       super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            uVar3._M_t.
            super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
            .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
            _M_head_impl = (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t, ppVar21 != ppVar9; ppVar21 = ppVar21 + 1) {
          poVar11 = std::operator<<((ostream *)
                                    uVar3._M_t.
                                    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                    ._M_head_impl," ");
          poVar11 = std::operator<<(poVar11,(string *)&(ppVar21->first).second);
          poVar11 = std::operator<<(poVar11,"/");
          std::operator<<(poVar11,(string *)&(ppVar21->second).second);
        }
        std::operator<<((ostream *)
                        uVar3._M_t.
                        super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                        ._M_head_impl," ]\n");
        local_b0.this = this;
        if ((ulong)(((long)bigger_cc.
                           super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)bigger_cc.
                          super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x50) < 3) {
          if ((long)bigger_cc.
                    super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)bigger_cc.
                    super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0xa0) {
            local_80.first._0_8_ =
                 colour_bound::anon_class_8_1_8991fb9c::operator()
                           (&local_b0,
                            bigger_cc.
                            super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            bigger_cc.
                            super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
            std::vector<long,_std::allocator<long>_>::emplace_back<long>(&to_sum,(long *)&local_80);
          }
        }
        else {
          poVar11 = std::operator<<((ostream *)
                                    (((this->_imp)._M_t.
                                      super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                      .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                     _M_head_impl)->proof_stream)._M_t,"p ");
          colour_bound::anon_class_8_1_8991fb9c::operator()
                    (&local_b0,
                     bigger_cc.
                     super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     bigger_cc.
                     super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
          std::ostream::_M_insert<long>((long)poVar11);
          for (uVar17 = 2;
              uVar3._M_t.
              super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
              .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
              _M_head_impl = (((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->proof_stream)._M_t,
              uVar17 < (ulong)(((long)bigger_cc.
                                      super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)bigger_cc.
                                     super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x50);
              uVar17 = (ulong)((int)uVar17 + 1)) {
            poVar11 = std::operator<<((ostream *)
                                      uVar3._M_t.
                                      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                      ._M_head_impl," ");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::operator<<(poVar11," *");
            for (lVar22 = 0;
                poVar11 = std::operator<<((ostream *)
                                          (((this->_imp)._M_t.
                                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                            .
                                            super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>
                                           ._M_head_impl)->proof_stream)._M_t," "),
                uVar17 * 0x50 - lVar22 != 0; lVar22 = lVar22 + 0x50) {
              colour_bound::anon_class_8_1_8991fb9c::operator()
                        (&local_b0,
                         bigger_cc.
                         super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar17,
                         (pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&((bigger_cc.
                                      super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->first).first +
                            lVar22));
              poVar11 = std::ostream::_M_insert<long>((long)poVar11);
              std::operator<<(poVar11," +");
            }
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::operator<<(poVar11," d");
          }
          std::operator<<((ostream *)
                          uVar3._M_t.
                          super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                          ._M_head_impl,'\n');
          _Var5._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
          plVar1 = &(_Var5._M_head_impl)->proof_line;
          *plVar1 = *plVar1 + 1;
          std::vector<long,_std::allocator<long>_>::push_back
                    (&to_sum,&(_Var5._M_head_impl)->proof_line);
        }
        std::
        vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&bigger_cc);
      }
      else {
        bigger_cc.
        super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
        if (uVar17 < 9) {
          if (uVar17 == 8) {
            local_80.first._0_8_ =
                 colour_bound::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)&bigger_cc,*piVar24,piVar24[1]);
            std::vector<long,_std::allocator<long>_>::emplace_back<long>(&to_sum,(long *)&local_80);
          }
        }
        else {
          poVar11 = std::operator<<((ostream *)((_Var5._M_head_impl)->proof_stream)._M_t,"p ");
          piVar24 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          colour_bound::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)&bigger_cc,*piVar24,piVar24[1]);
          std::ostream::_M_insert<long>((long)poVar11);
          for (uVar17 = 2;
              uVar3._M_t.
              super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
              .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
              _M_head_impl = (((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->proof_stream)._M_t,
              uVar17 < (ulong)((long)(pvVar20->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar20->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_start >> 2);
              uVar17 = (ulong)((int)uVar17 + 1)) {
            poVar11 = std::operator<<((ostream *)
                                      uVar3._M_t.
                                      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                      ._M_head_impl," ");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::operator<<(poVar11," *");
            for (uVar25 = 0;
                poVar11 = std::operator<<((ostream *)
                                          (((this->_imp)._M_t.
                                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                            .
                                            super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>
                                           ._M_head_impl)->proof_stream)._M_t," "), uVar17 != uVar25
                ; uVar25 = uVar25 + 1) {
              piVar14 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              colour_bound::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)&bigger_cc,piVar14[uVar17],piVar14[uVar25]);
              poVar11 = std::ostream::_M_insert<long>((long)poVar11);
              std::operator<<(poVar11," +");
            }
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::operator<<(poVar11," d");
          }
          std::operator<<((ostream *)
                          uVar3._M_t.
                          super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                          ._M_head_impl,'\n');
          _Var5._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
          plVar1 = &(_Var5._M_head_impl)->proof_line;
          *plVar1 = *plVar1 + 1;
          std::vector<long,_std::allocator<long>_>::push_back
                    (&to_sum,&(_Var5._M_head_impl)->proof_line);
        }
      }
      poVar11 = std::operator<<((ostream *)
                                (((this->_imp)._M_t.
                                  super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                  .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                 _M_head_impl)->proof_stream)._M_t,"p ");
      std::ostream::_M_insert<long>((long)poVar11);
      _Var5._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      plVar26 = to_sum.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      plVar8 = to_sum.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((_Var5._M_head_impl)->doing_mcs_by_clique == true) {
        for (p_Var13 = *(_Base_ptr *)
                        ((long)&(_Var5._M_head_impl)->at_least_one_value_constraints + 0x18);
            plVar26 = to_sum.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
            plVar8 = to_sum.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,
            p_Var13 !=
            (_Rb_tree_node_base *)((long)&(_Var5._M_head_impl)->at_least_one_value_constraints + 8U)
            ; p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
          poVar11 = std::operator<<((ostream *)
                                    (((this->_imp)._M_t.
                                      super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                      .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                     _M_head_impl)->proof_stream)._M_t," ");
          poVar11 = std::ostream::_M_insert<long>((long)poVar11);
          std::operator<<(poVar11," +");
        }
      }
      for (; uVar3._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl = (((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->proof_stream)._M_t, plVar26 != plVar8; plVar26 = plVar26 + 1) {
        poVar11 = std::operator<<((ostream *)
                                  uVar3._M_t.
                                  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                  ._M_head_impl," ");
        poVar11 = std::ostream::_M_insert<long>((long)poVar11);
        std::operator<<(poVar11," +");
      }
      std::operator<<((ostream *)
                      uVar3._M_t.
                      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,'\n');
      plVar1 = &((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_line
      ;
      *plVar1 = *plVar1 + 1;
    }
  }
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&to_sum.super__Vector_base<long,_std::allocator<long>_>);
  return;
}

Assistant:

auto Proof::colour_bound(const vector<vector<int>> & ccs) -> void
{
    *_imp->proof_stream << "* bound, ccs";
    for (auto & cc : ccs) {
        *_imp->proof_stream << " [";
        for (auto & c : cc)
            *_imp->proof_stream << " " << c;
        *_imp->proof_stream << " ]";
    }
    *_imp->proof_stream << '\n';

    if (_imp->recover_encoding && ! _imp->doing_hom_colour_proof) {
        for (auto & cc : ccs) {
            if (cc.size() == 1)
                continue;

            for (unsigned i = 0 ; i < cc.size() ; ++i)
                for (unsigned j = i + 1 ; j < cc.size() ; ++j)
                    if (! _imp->non_edge_constraints.contains(pair{cc[i], cc[j]})) {
                        *_imp->proof_stream << "# 0\n";
                        *_imp->proof_stream << "ea -1 x" << _imp->binary_variable_mappings[cc[i]]
                            << " -1 x" << _imp->binary_variable_mappings[cc[j]] << " >= -1 ;\n";
                        auto n = ++_imp->proof_line;
                        _imp->non_edge_constraints[{cc[i], cc[j]}] = n;
                        _imp->non_edge_constraints[{cc[j], cc[i]}] = n;
                        *_imp->proof_stream << "# " << _imp->active_level << '\n';
                    }
        }
    }

    vector<long> to_sum;
    auto do_one_cc = [&](const auto & cc, const auto & non_edge_constraint) {
        if (cc.size() > 2) {
            *_imp->proof_stream << "p " << non_edge_constraint(cc[0], cc[1]);

            for (unsigned i = 2; i < cc.size(); ++i) {
                *_imp->proof_stream << " " << i << " *";
                for (unsigned j = 0; j < i; ++j)
                    *_imp->proof_stream << " " << non_edge_constraint(cc[i], cc[j]) << " +";
                *_imp->proof_stream << " " << (i + 1) << " d";
            }

            *_imp->proof_stream << '\n';
            to_sum.push_back(++_imp->proof_line);
        }
        else if (cc.size() == 2) {
            to_sum.push_back(non_edge_constraint(cc[0], cc[1]));
        }
    };

    for (auto & cc : ccs) {
        if (cc.size() == 1)
            continue;

        if (_imp->doing_hom_colour_proof) {
            vector<pair<NamedVertex, NamedVertex>> bigger_cc;
            for (auto & c : cc)
                for (auto & v : _imp->p_clique)
                    bigger_cc.push_back(pair{v, _imp->t_clique_neighbourhood.find(c)->second});

            *_imp->proof_stream << "* colour class [";
            for (auto & c : bigger_cc)
                *_imp->proof_stream << " " << c.first.second << "/" << c.second.second;
            *_imp->proof_stream << " ]\n";

            do_one_cc(bigger_cc, [&](const pair<NamedVertex, NamedVertex> & a, const pair<NamedVertex, NamedVertex> & b) -> long {
                return _imp->clique_for_hom_non_edge_constraints[pair{a, b}];
            });
        }
        else
            do_one_cc(cc, [&](int a, int b) -> long { return _imp->non_edge_constraints[pair{a, b}]; });

        *_imp->proof_stream << "p " << _imp->objective_line;

        if (_imp->doing_mcs_by_clique) {
            for (auto & [_, v] : _imp->at_least_one_value_constraints) {
                *_imp->proof_stream << " " << get<1>(v) << " +";
            }
        }

        for (auto & t : to_sum)
            *_imp->proof_stream << " " << t << " +";
        *_imp->proof_stream << '\n';
        ++_imp->proof_line;
    }
}